

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestIteratorTestindexes::runTestCase(TestIteratorTestindexes *this)

{
  bool bVar1;
  undefined1 uVar2;
  uint line;
  Value *pVVar3;
  char *pcVar4;
  int __c;
  int __c_00;
  string *psVar5;
  long in_RDI;
  ValueIterator it;
  Value json;
  undefined4 in_stack_fffffffffffffd78;
  UInt in_stack_fffffffffffffd7c;
  undefined4 in_stack_fffffffffffffd80;
  uint in_stack_fffffffffffffd84;
  char *in_stack_fffffffffffffd88;
  char *expr;
  undefined4 in_stack_fffffffffffffd90;
  uint in_stack_fffffffffffffd94;
  Value *in_stack_fffffffffffffd98;
  TestResult *in_stack_fffffffffffffda0;
  TestResult *result;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  ValueIteratorBase *this_00;
  char *in_stack_fffffffffffffe08;
  string local_1f0 [4];
  uint in_stack_fffffffffffffe14;
  char *in_stack_fffffffffffffe18;
  Value *in_stack_fffffffffffffe20;
  Value *in_stack_fffffffffffffe28;
  TestResult *in_stack_fffffffffffffe30;
  string local_1c8 [128];
  string local_148 [39];
  allocator local_121;
  string local_120 [76];
  int in_stack_ffffffffffffff2c;
  Value *in_stack_ffffffffffffff30;
  ValueIteratorBase local_a0 [10];
  
  Json::Value::Value((Value *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                     (ValueType)((ulong)in_stack_fffffffffffffd88 >> 0x20));
  Json::Value::Value((Value *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                     in_stack_fffffffffffffd88);
  Json::Value::operator[](in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  Json::Value::operator=
            ((Value *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
             (Value *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  Json::Value::~Value((Value *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
  Json::Value::Value((Value *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                     in_stack_fffffffffffffd88);
  pVVar3 = Json::Value::operator[](in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  Json::Value::operator=
            ((Value *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
             (Value *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  Json::Value::~Value((Value *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
  Json::Value::begin(in_stack_fffffffffffffd98);
  Json::Value::end(in_stack_fffffffffffffd98);
  bVar1 = Json::ValueIteratorBase::operator!=
                    ((ValueIteratorBase *)
                     CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                     (SelfType *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd94
               ,in_stack_fffffffffffffd88);
  }
  Json::Value::Value((Value *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                     in_stack_fffffffffffffd7c);
  Json::ValueIteratorBase::key((ValueIteratorBase *)pVVar3);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,in_stack_fffffffffffffe08);
  Json::Value::~Value((Value *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
  Json::Value::~Value((Value *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
  this_00 = *(ValueIteratorBase **)(in_RDI + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"",&local_121);
  Json::ValueIteratorBase::name_abi_cxx11_(this_00);
  psVar5 = local_120;
  JsonTest::checkStringEqual
            (in_stack_fffffffffffffda0,(string *)in_stack_fffffffffffffd98,
             (string *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
             in_stack_fffffffffffffd88,in_stack_fffffffffffffd84,
             (char *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  Json::ValueIteratorBase::index(local_a0,(char *)psVar5,__c);
  JsonTest::checkEqual<int,unsigned_int>
            (in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
             (uint)in_stack_fffffffffffffd98,
             (char *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
             (uint)((ulong)in_stack_fffffffffffffd88 >> 0x20),
             (char *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  Json::ValueIterator::operator++
            ((ValueIterator *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  Json::Value::end(in_stack_fffffffffffffd98);
  uVar2 = Json::ValueIteratorBase::operator!=
                    ((ValueIteratorBase *)
                     CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                     (SelfType *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  if (!(bool)uVar2) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd94
               ,in_stack_fffffffffffffd88);
  }
  Json::Value::Value((Value *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                     in_stack_fffffffffffffd7c);
  Json::ValueIteratorBase::key((ValueIteratorBase *)pVVar3);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,in_stack_fffffffffffffe08);
  Json::Value::~Value((Value *)CONCAT17(uVar2,in_stack_fffffffffffffdb0));
  Json::Value::~Value((Value *)CONCAT17(uVar2,in_stack_fffffffffffffdb0));
  pVVar3 = *(Value **)(in_RDI + 8);
  result = (TestResult *)&stack0xfffffffffffffe37;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,"",(allocator *)result);
  Json::ValueIteratorBase::name_abi_cxx11_(this_00);
  psVar5 = local_1c8;
  JsonTest::checkStringEqual
            (result,(string *)pVVar3,
             (string *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
             in_stack_fffffffffffffd88,in_stack_fffffffffffffd84,
             (char *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe37);
  expr = *(char **)(in_RDI + 8);
  pcVar4 = Json::ValueIteratorBase::index(local_a0,(char *)psVar5,__c_00);
  line = (uint)pcVar4;
  JsonTest::checkEqual<int,unsigned_int>
            (result,(int)((ulong)pVVar3 >> 0x20),(uint)pVVar3,
             (char *)CONCAT44(line,in_stack_fffffffffffffd90),(uint)((ulong)expr >> 0x20),
             (char *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  Json::ValueIterator::operator++
            ((ValueIterator *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  Json::Value::end(pVVar3);
  bVar1 = Json::ValueIteratorBase::operator==
                    ((ValueIteratorBase *)
                     CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                     (SelfType *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  if (!bVar1) {
    JsonTest::TestResult::addFailure(result,(char *)pVVar3,line,expr);
  }
  Json::Value::~Value((Value *)CONCAT17(uVar2,in_stack_fffffffffffffdb0));
  return;
}

Assistant:

JSONTEST_FIXTURE(IteratorTest, indexes) {
  Json::Value json;
  json[0] = "a";
  json[1] = "b";
  Json::ValueIterator it = json.begin();
  JSONTEST_ASSERT(it != json.end());
  JSONTEST_ASSERT_EQUAL(Json::Value(Json::ArrayIndex(0)), it.key());
  JSONTEST_ASSERT_STRING_EQUAL("", it.name());
  JSONTEST_ASSERT_EQUAL(0, it.index());
  ++it;
  JSONTEST_ASSERT(it != json.end());
  JSONTEST_ASSERT_EQUAL(Json::Value(Json::ArrayIndex(1)), it.key());
  JSONTEST_ASSERT_STRING_EQUAL("", it.name());
  JSONTEST_ASSERT_EQUAL(1, it.index());
  ++it;
  JSONTEST_ASSERT(it == json.end());
}